

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

int findfield(lua_State *L,int objidx,int level)

{
  int iVar1;
  
  if ((level != 0) && (iVar1 = lua_type(L,-1), iVar1 == 5)) {
    lua_pushnil(L);
    iVar1 = lua_next(L,-2);
    if (iVar1 != 0) {
      do {
        iVar1 = lua_type(L,-2);
        if (iVar1 == 4) {
          iVar1 = lua_rawequal(L,objidx,-1);
          if (iVar1 != 0) {
            lua_settop(L,-2);
            return 1;
          }
          iVar1 = findfield(L,objidx,level + -1);
          if (iVar1 != 0) {
            lua_rotate(L,-2,-1);
            lua_settop(L,-2);
            lua_pushstring(L,".");
            lua_rotate(L,-2,1);
            lua_concat(L,3);
            return 1;
          }
        }
        lua_settop(L,-2);
        iVar1 = lua_next(L,-2);
      } while (iVar1 != 0);
    }
  }
  return 0;
}

Assistant:

static int findfield (lua_State *L, int objidx, int level) {
  if (level == 0 || !lua_istable(L, -1))
    return 0;  /* not found */
  lua_pushnil(L);  /* start 'next' loop */
  while (lua_next(L, -2)) {  /* for each pair in table */
    if (lua_type(L, -2) == LUA_TSTRING) {  /* ignore non-string keys */
      if (lua_rawequal(L, objidx, -1)) {  /* found object? */
        lua_pop(L, 1);  /* remove value (but keep name) */
        return 1;
      }
      else if (findfield(L, objidx, level - 1)) {  /* try recursively */
        lua_remove(L, -2);  /* remove table (but keep name) */
        lua_pushliteral(L, ".");
        lua_insert(L, -2);  /* place '.' between the two names */
        lua_concat(L, 3);
        return 1;
      }
    }
    lua_pop(L, 1);  /* remove value */
  }
  return 0;  /* not found */
}